

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O3

void __thiscall AllReduceSockets::~AllReduceSockets(AllReduceSockets *this)

{
  ~AllReduceSockets(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~AllReduceSockets() {}